

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O0

void compaction_failure_hangs_rollback_test(void)

{
  fdb_status fVar1;
  anomalous_callbacks *paVar2;
  size_t sVar3;
  void *meta;
  fdb_file_handle *in_stack_fffffffffffff3e8;
  anomalous_callbacks *in_stack_fffffffffffff3f0;
  fdb_doc **in_stack_fffffffffffff3f8;
  size_t in_stack_fffffffffffff410;
  fdb_seqnum_t in_stack_fffffffffffff510;
  fdb_kvs_handle **in_stack_fffffffffffff518;
  fdb_config *in_stack_fffffffffffff608;
  char *in_stack_fffffffffffff610;
  fdb_file_handle **in_stack_fffffffffffff618;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  uint local_168;
  fail_ctx_t fail_ctx;
  anomalous_callbacks *commit_fail_cb;
  char bodybuf [128];
  char metabuf [32];
  char keybuf [32];
  fdb_status status;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_comp;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  paVar2 = get_default_anon_cbs();
  memset(&fconfig.bottom_up_index_build,0,0xc);
  paVar2->fsync_cb = fsync_failure_cb;
  system("rm -rf  anomaly_test* > errorlog.txt");
  filemgr_ops_anomalous_init(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.purging_interval = 1;
  fconfig.wal_threshold._4_4_ = 0;
  fdb_open(in_stack_fffffffffffff618,in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  fdb_kvs_open_default
            ((fdb_file_handle *)in_stack_fffffffffffff3f0,&in_stack_fffffffffffff3e8->root,
             (fdb_kvs_config *)0x109e68);
  n = 0;
  do {
    if (299 < n) {
      fVar1 = fdb_commit(in_stack_fffffffffffff3e8,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x3bc);
        compaction_failure_hangs_rollback_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x3bc,"void compaction_failure_hangs_rollback_test()");
        }
      }
      fVar1 = fdb_open(in_stack_fffffffffffff618,in_stack_fffffffffffff610,in_stack_fffffffffffff608
                      );
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x3bf);
        compaction_failure_hangs_rollback_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x3bf,"void compaction_failure_hangs_rollback_test()");
        }
      }
      fVar1 = fdb_compact((fdb_file_handle *)in_stack_fffffffffffff3f0,
                          (char *)in_stack_fffffffffffff3e8);
      if (fVar1 != FDB_RESULT_FSYNC_FAIL) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x3c4);
        compaction_failure_hangs_rollback_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_FSYNC_FAIL) {
          __assert_fail("status == FDB_RESULT_FSYNC_FAIL",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x3c4,"void compaction_failure_hangs_rollback_test()");
        }
      }
      fVar1 = fdb_close(in_stack_fffffffffffff3e8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x3c8);
        compaction_failure_hangs_rollback_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x3c8,"void compaction_failure_hangs_rollback_test()");
        }
      }
      fVar1 = fdb_rollback(in_stack_fffffffffffff518,in_stack_fffffffffffff510);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,0x3ce);
        compaction_failure_hangs_rollback_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                        ,0x3ce,"void compaction_failure_hangs_rollback_test()");
        }
      }
      fdb_close(in_stack_fffffffffffff3e8);
      for (n = 0; n < 300; n = n + 1) {
        fdb_doc_free((fdb_doc *)0x10a338);
      }
      fdb_shutdown();
      sprintf((char *)&commit_fail_cb,
              "compaction failure hangs rollback test :%d failures out of %d commits",
              (ulong)(uint)fconfig._244_4_,(ulong)local_168);
      if (compaction_failure_hangs_rollback_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n",&commit_fail_cb);
      }
      else {
        fprintf(_stderr,"%s PASSED\n",&commit_fail_cb);
      }
      return;
    }
    sprintf(metabuf + 0x18,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0x78,"meta%d",(ulong)(uint)n);
    sprintf((char *)&commit_fail_cb,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0x18);
    strlen(bodybuf + 0x78);
    meta = (void *)0x109f3d;
    sVar3 = strlen((char *)&commit_fail_cb);
    fdb_doc_create(in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0,
                   (size_t)in_stack_fffffffffffff3e8,meta,sVar3 + 1,(void *)0x109f78,
                   in_stack_fffffffffffff410);
    fVar1 = fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffff3e8 + (long)n * 8));
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x3b4);
      compaction_failure_hangs_rollback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x3b4,"void compaction_failure_hangs_rollback_test()");
      }
    }
    if ((n == 0x96) &&
       (fVar1 = fdb_commit(in_stack_fffffffffffff3e8,'\0'), fVar1 != FDB_RESULT_SUCCESS)) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x3b7);
      compaction_failure_hangs_rollback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x3b7,"void compaction_failure_hangs_rollback_test()");
      }
    }
    n = n + 1;
  } while( true );
}

Assistant:

void compaction_failure_hangs_rollback_test()
{
    TEST_INIT();

    int i, r;
    int n=300; // n: # prefixes, m: # postfixes
    fdb_file_handle *dbfile, *dbfile_comp;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;

    char keybuf[32], metabuf[32], bodybuf[128];
    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *commit_fail_cb = get_default_anon_cbs();
    fail_ctx_t fail_ctx;
    memset(&fail_ctx, 0, sizeof(fail_ctx_t));
    // Modify the fsync callback to redirect to test-specific function
    commit_fail_cb->fsync_cb = &fsync_failure_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    // Reset anomalous behavior stats..
    filemgr_ops_anomalous_init(commit_fail_cb, &fail_ctx);

    // The number indicates the count after which all commits begin to fail
    // This number is unique to this test suite and can cause a hang
    // if the underlying fixed issue resurfaces
    fail_ctx.start_failing_after = 3;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;

    // open db
    fdb_open(&dbfile, "anomaly_test2", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf)+1,
                       (void*)metabuf, strlen(metabuf)+1,
                       (void*)bodybuf, strlen(bodybuf)+1);
        status = fdb_set(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (i == n / 2) {
            status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_open(&dbfile_comp, "anomaly_test2", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Due to anomalous ops this compaction should fail after new file
    // is created and a final commit is attempted..
    status = fdb_compact(dbfile_comp, "anomaly_test3");
    TEST_CHK(status == FDB_RESULT_FSYNC_FAIL);
    fail_ctx.start_failing_after = 99999; // reset this so rollback can proceed

    status = fdb_close(dbfile_comp);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // The above compaction failure should not result in rollback hanging..
    // MB-21953: Rollback hangs infinitely in decaying_usleep due to compaction
    // failure above which does not reset the file status to NORMAL
    status = fdb_rollback(&db, n/2 + 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    sprintf(bodybuf, "compaction failure hangs rollback test :%d "
                     "failures out of %d commits",
                     fail_ctx.num_fails, fail_ctx.num_ops);

    TEST_RESULT(bodybuf);
}